

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_new_leaf(lyd_node *parent,lys_module *module,char *name,char *val_str)

{
  ly_ctx *ctx;
  char *name_00;
  char *pcVar1;
  int iVar2;
  lys_node *node;
  lys_node *parent_00;
  size_t sVar3;
  lys_module *plVar4;
  lys_node *siblings;
  lys_node *snode;
  char *val_str_local;
  char *name_local;
  lys_module *module_local;
  lyd_node *parent_local;
  
  siblings = (lys_node *)0x0;
  snode = (lys_node *)val_str;
  val_str_local = name;
  name_local = (char *)module;
  module_local = (lys_module *)parent;
  if (((parent == (lyd_node *)0x0) && (module == (lys_module *)0x0)) || (name == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new_leaf");
    parent_local = (lyd_node *)0x0;
  }
  else {
    node = lyd_new_find_schema(parent,module,0);
    pcVar1 = name_local;
    if (node == (lys_node *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new_leaf");
      parent_local = (lyd_node *)0x0;
    }
    else {
      parent_00 = lys_parent(node);
      name_00 = val_str_local;
      sVar3 = strlen(val_str_local);
      iVar2 = lys_getnext_data((lys_module *)pcVar1,parent_00,name_00,(int)sVar3,
                               LYS_LEAFLIST|LYS_LEAF,0,&siblings);
      pcVar1 = val_str_local;
      if ((iVar2 == 0) && (siblings != (lys_node *)0x0)) {
        parent_local = _lyd_new_leaf((lyd_node *)module_local,siblings,(char *)snode,0,0);
      }
      else {
        ctx = node->module->ctx;
        plVar4 = lys_node_module(node);
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Failed to find \"%s\" as a sibling to \"%s:%s\".",pcVar1,
               plVar4->name,node->name);
        parent_local = (lyd_node *)0x0;
      }
    }
  }
  return parent_local;
}

Assistant:

lyd_node *
lyd_new_leaf(struct lyd_node *parent, const struct lys_module *module, const char *name, const char *val_str)
{
    const struct lys_node *snode = NULL, *siblings;

    if ((!parent && !module) || !name) {
        LOGARG;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 0);
    if (!siblings) {
        LOGARG;
        return NULL;
    }

    if (lys_getnext_data(module, lys_parent(siblings), name, strlen(name), LYS_LEAFLIST | LYS_LEAF, 0, &snode) || !snode) {
        LOGERR(siblings->module->ctx, LY_EINVAL, "Failed to find \"%s\" as a sibling to \"%s:%s\".",
               name, lys_node_module(siblings)->name, siblings->name);
        return NULL;
    }

    return _lyd_new_leaf(parent, snode, val_str, 0, 0);
}